

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::key_press(PathTracer *this,int key)

{
  value_type pBVar1;
  reference ppBVar2;
  BVHNode *pBVar3;
  BVHNode *current;
  int key_local;
  PathTracer *this_local;
  
  ppBVar2 = std::
            stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
            ::top(&this->selectionHistory);
  pBVar1 = *ppBVar2;
  if (key == 0x3c) {
LAB_002355cc:
    if (pBVar1->l == (BVHNode *)0x0) {
      return;
    }
    std::
    stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
    ::push(&this->selectionHistory,&pBVar1->l);
    return;
  }
  if (key == 0x3e) {
LAB_002355f1:
    if (pBVar1->l == (BVHNode *)0x0) {
      return;
    }
    std::
    stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
    ::push(&this->selectionHistory,&pBVar1->r);
    return;
  }
  if (key == 0x3f) {
LAB_00235599:
    pBVar3 = StaticScene::BVHAccel::get_root(this->bvh);
    if (pBVar1 != pBVar3) {
      std::
      stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
      ::pop(&this->selectionHistory);
    }
  }
  else {
    if (key != 0x53) {
      if (key == 0x5b) {
        this->ns_aa = this->ns_aa >> 1;
        if (this->ns_aa == 0) {
          this->ns_aa = 1;
        }
        printf("Samples per pixel changed to %lu\n",this->ns_aa);
        return;
      }
      if (key == 0x5d) {
        this->ns_aa = this->ns_aa << 1;
        printf("Samples per pixel changed to %lu\n",this->ns_aa);
        return;
      }
      if (key != 0x73) {
        if (key == 0x106) goto LAB_002355f1;
        if (key == 0x107) goto LAB_002355cc;
        if (key != 0x109) {
          return;
        }
        goto LAB_00235599;
      }
    }
    this->show_rays = (bool)((this->show_rays ^ 0xffU) & 1);
  }
  return;
}

Assistant:

void PathTracer::key_press(int key) {

    BVHNode *current = selectionHistory.top();
    switch (key) {
      case ']':
        ns_aa *=2;
        printf("Samples per pixel changed to %lu\n", ns_aa);
        //tm_key = clamp(tm_key + 0.02f, 0.0f, 1.0f);
        break;
      case '[':
        //tm_key = clamp(tm_key - 0.02f, 0.0f, 1.0f);
        ns_aa /=2;
        if (ns_aa < 1) ns_aa = 1;
        printf("Samples per pixel changed to %lu\n", ns_aa);
        break;
      case KEYBOARD_UP: case '?':
        if (current != bvh->get_root()) {
          selectionHistory.pop();
        }
        break;
      case KEYBOARD_LEFT: case '<':
        if (current->l) {
          selectionHistory.push(current->l);
        }
        break;
      case KEYBOARD_RIGHT: case '>':
        if (current->l) {
          selectionHistory.push(current->r);
        }
        break;
      case 's':
      case 'S':
        show_rays = !show_rays;
      default:
        return;
    }
  }